

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O1

void __thiscall
tchecker::algorithms::couvscc::
single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::push
          (single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t> *this
          ,node_sptr_t *n,zg_t *ts,graph_t *graph,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,stats_t *stats)

{
  uint *puVar1;
  bool *pbVar2;
  unsigned_long *puVar3;
  uint uVar4;
  todo_stack_entry_t local_88;
  
  uVar4 = this->_count + 1;
  this->_count = uVar4;
  if ((node_t *)n->_t != (node_t *)0x0) {
    puVar1 = couvscc::node_t::dfsnum((node_t *)n->_t);
    *puVar1 = uVar4;
    if ((node_t *)n->_t != (node_t *)0x0) {
      pbVar2 = couvscc::node_t::current((node_t *)n->_t);
      *pbVar2 = true;
      local_88.n._t =
           (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
            *)0x0;
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::reset(&local_88.n,n->_t);
      expand_node(&local_88.succ,this,n,ts,graph,labels,stats);
      std::
      deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>>
      ::
      emplace_back<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>
                ((deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>>
                  *)&this->_todo,&local_88);
      std::
      deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
      ::~deque(&local_88.succ);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_88.n);
      local_88.n._t =
           (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
            *)0x0;
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::reset(&local_88.n,n->_t);
      std::
      deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
      ::
      emplace_back<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>
                ((deque<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::single_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
                  *)&this->_roots,(roots_stack_entry_t *)&local_88);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_88.n);
      std::
      deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
      ::push_back(&(this->_active).c,n);
      puVar3 = stats_t::visited_states(stats);
      *puVar3 = *puVar3 + 1;
      return;
    }
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,
                "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>]"
               );
}

Assistant:

void push(node_sptr_t & n, TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels,
            tchecker::algorithms::couvscc::stats_t & stats)
  {
    ++_count;
    n->dfsnum() = _count;
    n->current() = true;
    _todo.push(todo_stack_entry_t{n, expand_node(n, ts, graph, labels, stats)});
    _roots.push(roots_stack_entry_t{n});
    _active.push(n);
    ++stats.visited_states();
  }